

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

char * parasail_reverse(char *s,size_t length)

{
  size_t _size;
  size_t j;
  size_t i;
  char *r;
  size_t length_local;
  char *s_local;
  
  s_local = (char *)malloc(length + 1);
  if (s_local == (char *)0x0) {
    fprintf(_stderr,"%s: failed to malloc %zu bytes\n","parasail_reverse",length + 1);
    s_local = (char *)0x0;
  }
  else {
    s_local[length] = '\0';
    _size = length - 1;
    for (j = 0; j < length; j = j + 1) {
      s_local[j] = s[_size];
      _size = _size - 1;
    }
  }
  return s_local;
}

Assistant:

char* parasail_reverse(const char *s, size_t length)
{
    char *r = NULL;
    size_t i = 0;
    size_t j = 0;

    PARASAIL_CALLOC(r, char, length+1);
    r[length] = '\0';
    for (i=0,j=length-1; i<length; ++i,--j) {
        r[i] = s[j];
    }

    return r;
}